

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::singletonRow(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row)

{
  HPresolveAnalysis *this_00;
  double coef;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  HighsVarType HVar5;
  uint uVar6;
  int col;
  HighsLp *pHVar7;
  bool tightenedColLower;
  Result RVar8;
  bool tightenedColUpper;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_108;
  double local_e8;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  this_00 = &this->analysis_;
  bVar4 = (this->analysis_).logging_on_;
  if (bVar4 == true) {
    HPresolveAnalysis::startPresolveRuleLog(this_00,1);
  }
  uVar6 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  col = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)uVar6];
  coef = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[(int)uVar6];
  markRowDeleted(this,row);
  unlink(this,(char *)(ulong)uVar6);
  pHVar7 = this->model;
  dVar12 = (pHVar7->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[row];
  dVar1 = this->primal_feastol;
  if (coef <= 0.0) {
    if ((pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[col] * coef <= dVar12 + dVar1) {
      dVar10 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
      if (dVar10 - dVar1 <=
          (pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] * coef) goto LAB_0030841f;
    }
    else {
      dVar10 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
    }
    dVar13 = INFINITY;
    dVar12 = (double)(~-(ulong)(dVar12 < INFINITY) & 0xfff0000000000000 |
                     (ulong)(dVar12 / coef) & -(ulong)(dVar12 < INFINITY));
    if (-INFINITY < dVar10) {
      dVar13 = dVar10 / coef;
    }
  }
  else {
    if ((pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[col] * coef <= dVar12 + dVar1) {
      dVar10 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
      if (dVar10 - dVar1 <=
          (pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] * coef) {
LAB_0030841f:
        HighsPostsolveStack::redundantRow(postsolve_stack,row);
        (this->analysis_).logging_on_ = bVar4;
        if (bVar4 != false) {
          HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
        }
        RVar8 = checkLimits(this,postsolve_stack);
        return RVar8;
      }
    }
    else {
      dVar10 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
    }
    dVar13 = (double)(~-(ulong)(dVar12 < INFINITY) & 0x7ff0000000000000 |
                     (ulong)(dVar12 / coef) & -(ulong)(dVar12 < INFINITY));
    dVar12 = -INFINITY;
    if (-INFINITY < dVar10) {
      dVar12 = dVar10 / coef;
    }
  }
  dVar9 = ABS(coef);
  dVar10 = dVar9;
  if (dVar9 <= 1.0) {
    dVar10 = 1.0;
  }
  dVar10 = dVar1 / dVar10;
  HVar5 = (pHVar7->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[col];
  dVar2 = (pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar11 = dVar10 + dVar2;
  dVar3 = (pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar14 = dVar3 - dVar10;
  tightenedColUpper = dVar13 < dVar14;
  tightenedColLower = dVar11 < dVar12;
  if (dVar12 <= dVar11) {
    local_e8 = (double)(~-(ulong)(dVar13 < dVar14) & (ulong)dVar3 |
                       -(ulong)(dVar13 < dVar14) & (ulong)dVar13);
    local_108 = dVar2;
    if ((dVar13 < dVar14) && (HVar5 != kContinuous)) {
LAB_003082df:
      local_e8 = floor(dVar10 + dVar13);
    }
  }
  else {
    local_e8 = dVar3;
    if (HVar5 == kContinuous) {
      local_108 = dVar12;
      if (dVar13 < dVar14) {
        local_e8 = dVar13;
      }
    }
    else {
      local_108 = ceil(dVar12 - dVar10);
      if (dVar13 < dVar14) goto LAB_003082df;
    }
  }
  if (dVar1 + local_108 < local_e8) goto LAB_00308360;
  if (local_e8 < local_108 - dVar1) {
    return kPrimalInfeasible;
  }
  if (local_108 <= local_e8) {
    if (local_e8 <= local_108) goto LAB_00308360;
    dVar10 = getMaxAbsColVal(this,col);
    if (dVar10 <= dVar9) {
      dVar10 = dVar9;
    }
    if (dVar1 < dVar10 * (local_e8 - local_108)) goto LAB_00308360;
  }
  if ((dVar12 <= dVar11) || (dVar14 <= dVar13)) {
    if (dVar11 < dVar12) {
      tightenedColLower = dVar2 < local_e8;
      local_108 = local_e8;
      goto LAB_00308360;
    }
    tightenedColLower = false;
  }
  else {
    local_108 = (local_108 + local_e8) * 0.5;
    tightenedColLower = dVar2 < local_108;
  }
  tightenedColUpper = local_108 < dVar3;
  local_e8 = local_108;
LAB_00308360:
  HighsPostsolveStack::singletonRow
            (postsolve_stack,row,col,coef,tightenedColLower,tightenedColUpper);
  if (tightenedColLower) {
    changeColLower(this,col,local_108);
  }
  if ((local_e8 != local_108) || (NAN(local_e8) || NAN(local_108))) {
    if (tightenedColUpper != false) {
      changeColUpper(this,col,local_e8);
    }
  }
  else {
    local_50.nodeValue =
         (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.nodeIndex =
         (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_50.nodeNext =
         (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_50.head =
         (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[col];
    HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
              (postsolve_stack,col,local_108,
               (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col],&local_50);
    removeFixedCol(this,col);
  }
  if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0') &&
     ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[col] == 0)) {
    RVar8 = emptyCol(this,postsolve_stack,col);
    (this->analysis_).logging_on_ = bVar4;
    if (bVar4 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
    }
  }
  else {
    (this->analysis_).logging_on_ = bVar4;
    if (bVar4 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
    }
    RVar8 = checkLimits(this,postsolve_stack);
  }
  return RVar8;
}

Assistant:

HPresolve::Result HPresolve::singletonRow(HighsPostsolveStack& postsolve_stack,
                                          HighsInt row) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleSingletonRow);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 1);

  // the tree of nonzeros of this row should just contain the single nonzero
  HighsInt nzPos = rowroot[row];
  assert(nzPos != -1);
  // nonzero should have the row in the row array
  assert(Arow[nzPos] == row);
  // tree with one element should not have children
  assert(ARleft[nzPos] == -1);
  assert(ARright[nzPos] == -1);

  HighsInt col = Acol[nzPos];
  double val = Avalue[nzPos];

  // printf("singleton row\n");
  // debugPrintRow(row);
  // delete row singleton nonzero directly, we have all information that we need
  // in local variables
  markRowDeleted(row);
  unlink(nzPos);

  // check for simple
  if (val > 0) {
    if (model->col_upper_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_lower_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  } else {
    if (model->col_lower_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_upper_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  }

  // zeros should not be linked in the matrix
  assert(std::fabs(val) > options->small_matrix_value);

  double newColUpper = kHighsInf;
  double newColLower = -kHighsInf;
  if (val > 0) {
    if (model->row_upper_[row] != kHighsInf)
      newColUpper = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColLower = model->row_lower_[row] / val;
  } else {
    if (model->row_upper_[row] != kHighsInf)
      newColLower = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColUpper = model->row_lower_[row] / val;
  }

  // use either the primal feasibility tolerance for the bound constraint or
  // for the singleton row including scaling, whichever is tighter.
  const double boundTol = primal_feastol / std::max(1.0, std::fabs(val));
  const bool isIntegral = model->integrality_[col] != HighsVarType::kContinuous;

  bool lowerTightened = newColLower > model->col_lower_[col] + boundTol;
  bool upperTightened = newColUpper < model->col_upper_[col] - boundTol;

  double lb, ub;
  if (lowerTightened) {
    if (isIntegral) newColLower = std::ceil(newColLower - boundTol);
    lb = newColLower;
  } else
    lb = model->col_lower_[col];

  if (upperTightened) {
    if (isIntegral) newColUpper = std::floor(newColUpper + boundTol);
    ub = newColUpper;
  } else
    ub = model->col_upper_[col];

  // printf("old bounds [%.15g,%.15g], new bounds [%.15g,%.15g] ... ",
  //        model->col_lower_[col], model->col_upper_[col], lb, ub);
  // check whether the bounds are equal in tolerances
  if (ub <= lb + primal_feastol) {
    // bounds could be infeasible or equal in tolerances, first check infeasible
    if (ub < lb - primal_feastol) return Result::kPrimalInfeasible;

    // bounds are equal in tolerances, if they have a slight infeasibility below
    // those tolerances or they have a slight numerical distance which changes
    // the largest contribution below feasibility tolerance then we can safely
    // set the bound to one of the values. To heuristically get rid of numerical
    // errors we choose the bound that was not tightened, or the midpoint if
    // both where tightened.
    if (ub < lb || (ub > lb && (ub - lb) * std::max(std::fabs(val),
                                                    getMaxAbsColVal(col)) <=
                                   primal_feastol)) {
      if (lowerTightened && upperTightened) {
        ub = 0.5 * (ub + lb);
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
        upperTightened = ub < model->col_upper_[col];
      } else if (lowerTightened) {
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
      } else {
        ub = lb;
        upperTightened = ub < model->col_upper_[col];
      }
    }
  }

  // printf("final bounds: [%.15g,%.15g]\n", lb, ub);

  postsolve_stack.singletonRow(row, col, val, lowerTightened, upperTightened);

  // just update bounds (and row activities)
  if (lowerTightened) changeColLower(col, lb);
  // update bounds, or remove as fixed column directly
  if (ub == lb) {
    postsolve_stack.removedFixedCol(col, lb, model->col_cost_[col],
                                    getColumnVector(col));
    removeFixedCol(col);
  } else if (upperTightened)
    changeColUpper(col, ub);

  if (!colDeleted[col] && colsize[col] == 0) {
    Result result = emptyCol(postsolve_stack, col);
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
    return result;
  }
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
  return checkLimits(postsolve_stack);
}